

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_sectors.cxx
# Opt level: O2

void __thiscall level_tools::reconstruct_sectors(level_tools *this)

{
  xr_custom_object_vec *this_00;
  uint32_t *puVar1;
  pointer ppsVar2;
  uint16_t uVar3;
  xr_scene_sectors *pxVar4;
  xr_sector_object *this_01;
  int iVar5;
  pointer ppsVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  xr_name_gen name;
  xr_sector_object *local_38;
  
  if (this->m_level->m_sectors != (xr_level_sectors *)0x0) {
    uVar9 = 0;
    xray_re::msg("building %s","sector.part");
    pxVar4 = xray_re::xr_scene::sectors(this->m_scene);
    this_00 = &(pxVar4->super_xr_scene_objects).m_objects;
    this->m_scene_sectors = this_00;
    std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::reserve
              (this_00,(long)(this->m_sectors->
                             super__Vector_base<xray_re::sector_data_*,_std::allocator<xray_re::sector_data_*>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_sectors->
                             super__Vector_base<xray_re::sector_data_*,_std::allocator<xray_re::sector_data_*>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 3);
    uVar3 = get_default_sector_idx(this);
    this->m_default_sector_idx = uVar3;
    xray_re::msg("selected sector #%u (of %Iu) as default",(ulong)uVar3,
                 (long)(this->m_sectors->
                       super__Vector_base<xray_re::sector_data_*,_std::allocator<xray_re::sector_data_*>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_sectors->
                       super__Vector_base<xray_re::sector_data_*,_std::allocator<xray_re::sector_data_*>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 3);
    xray_re::xr_name_gen::init(&name,(EVP_PKEY_CTX *)0x1c90aa);
    ppsVar2 = (this->m_sectors->
              super__Vector_base<xray_re::sector_data_*,_std::allocator<xray_re::sector_data_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    uVar3 = 0;
    for (ppsVar6 = (this->m_sectors->
                   super__Vector_base<xray_re::sector_data_*,_std::allocator<xray_re::sector_data_*>_>
                   )._M_impl.super__Vector_impl_data._M_start; ppsVar6 != ppsVar2;
        ppsVar6 = ppsVar6 + 1) {
      this_01 = (xr_sector_object *)operator_new(0x98);
      xray_re::xr_sector_object::xr_sector_object(this_01,this->m_scene);
      if (uVar3 == this->m_default_sector_idx) {
        std::__cxx11::string::assign((char *)&(this_01->super_xr_custom_object).m_name);
        puVar1 = &(this_01->super_xr_custom_object).m_flags;
        *(byte *)puVar1 = (byte)*puVar1 & 0xfd;
        this_01->m_private = '\x01';
        *(undefined4 *)&(this_01->super_xr_custom_object).field_0x6c = 0x3f800000;
        fVar10 = 0.0;
        fVar11 = 0.0;
      }
      else {
        std::__cxx11::string::assign((char *)&(this_01->super_xr_custom_object).m_name);
        xray_re::xr_name_gen::next(&name);
        this_01->m_private = '\0';
        while( true ) {
          iVar8 = (int)((ulong)uVar9 / 3) * -3;
          iVar5 = (int)(((ulong)uVar9 / 3) % 3);
          iVar7 = (int)(((ulong)uVar9 / 9) % 3);
          if ((((uVar9 + iVar8 != 2) || (iVar5 != 2)) || (iVar7 != 2)) &&
             ((((uVar9 + iVar8 != 1 || (iVar5 != 1)) || (iVar7 != 1)) &&
              ((1 < (iVar8 + uVar9) - 1 || (iVar7 != 0 || iVar5 != 0) &&
               ((iVar7 != 0 || iVar5 != 0) || uVar9 + iVar8 != 0)))))) break;
          uVar9 = uVar9 + 1;
        }
        fVar10 = (float)iVar5 * 0.5;
        fVar11 = (float)iVar7 * 0.5;
        *(float *)&(this_01->super_xr_custom_object).field_0x6c = (float)(uVar9 % 3) * 0.5;
        uVar9 = uVar9 + 1;
      }
      *(float *)&this_01->field_0x70 = fVar10;
      *(float *)&this_01->field_0x74 = fVar11;
      *(undefined4 *)&this_01->field_0x78 = 0;
      local_38 = this_01;
      std::vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>>::
      emplace_back<xray_re::xr_custom_object*>
                ((vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>> *)
                 this->m_scene_sectors,(xr_custom_object **)&local_38);
      uVar3 = uVar3 + 1;
    }
    xray_re::xr_name_gen::~xr_name_gen(&name);
  }
  return;
}

Assistant:

void level_tools::reconstruct_sectors()
{
	if (m_level->sectors() == 0)
		return;
	msg("building %s", "sector.part");

	m_scene_sectors = &m_scene->sectors()->objects();
	m_scene_sectors->reserve(m_sectors->size());

	m_default_sector_idx = get_default_sector_idx();
	msg("selected sector #%u (of %" PRIuSIZET ") as default", m_default_sector_idx, m_sectors->size());

	uint16_t sector_idx = 0;
	unsigned seed = 0;
	xr_name_gen name("sector");
	for (sector_data_vec_cit it = m_sectors->begin(),
			end = m_sectors->end(); it != end; ++it, ++sector_idx) {
		xr_sector_object* new_sector = new xr_sector_object(*m_scene);
		if (sector_idx == m_default_sector_idx) {
			new_sector->co_name() = "Sector_DEFAULT";
			new_sector->co_flags() &= ~COF_VISIBLE;
			new_sector->priv() = true;
			new_sector->color().set(1.f, 0, 0, 0);
		} else {
			new_sector->co_name() = name.get();
			name.next();
			new_sector->priv() = false;
			unsigned r, g, b;
			do {
				r = seed%3;
				g = (seed/3)%3;
				b = (seed/9)%3;
				++seed;
			} while (invalid_sector_color(r, g, b));
			new_sector->color().set(r*0.5f, g*0.5f, b*0.5f);
		}
		m_scene_sectors->push_back(new_sector);
	}
}